

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::removeUndoWatch(Solver *this,uint32 dl,Constraint *c)

{
  long lVar1;
  bool bVar2;
  reference pDVar3;
  Constraint **ppCVar4;
  iterator ppCVar5;
  reference ppCVar6;
  Constraint **in_RDX;
  int in_ESI;
  ConstraintDB *in_RDI;
  iterator it;
  ConstraintDB *uList;
  Constraint *in_stack_ffffffffffffffc0;
  Constraint **in_stack_ffffffffffffffd0;
  Constraint **ppCVar7;
  Dirty *this_00;
  
  pDVar3 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::
           operator[]((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
                      &in_RDI[0x12].ebo_.size,in_ESI - 1);
  if (pDVar3->undo != (ConstraintDB *)0x0) {
    pDVar3 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::
             operator[]((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *
                        )&in_RDI[0x12].ebo_.size,in_ESI - 1);
    this_00 = (Dirty *)pDVar3->undo;
    lVar1._0_4_ = in_RDI[10].ebo_.size;
    lVar1._4_4_ = in_RDI[10].ebo_.cap;
    if ((lVar1 == 0) ||
       (bVar2 = Dirty::add(this_00,(uint32)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_RDI,
                           in_stack_ffffffffffffffc0), !bVar2)) {
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)this_00);
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)this_00);
      ppCVar4 = std::find<Clasp::Constraint**,Clasp::Constraint*>
                          (in_RDX,(Constraint **)this_00,in_stack_ffffffffffffffd0);
      ppCVar7 = ppCVar4;
      ppCVar5 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                          ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                           this_00);
      if (ppCVar4 != ppCVar5) {
        ppCVar6 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                  back((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                       this_00);
        *ppCVar7 = *ppCVar6;
        bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pop_back
                  ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)this_00)
        ;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Solver::removeUndoWatch(uint32 dl, Constraint* c) {
	assert(dl != 0 && dl <= decisionLevel() );
	if (levels_[dl-1].undo) {
		ConstraintDB& uList = *levels_[dl-1].undo;
		if (!lazyRem_ || !lazyRem_->add(dl - 1, uList, c)) {
			ConstraintDB::iterator it = std::find(uList.begin(), uList.end(), c);
			if (it != uList.end()) {
				*it = uList.back();
				uList.pop_back();
				return true;
			}
		}
	}
	return false;
}